

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O2

SinkCombineResultType __thiscall
duckdb::PhysicalHashAggregate::Combine
          (PhysicalHashAggregate *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  GlobalSinkState *pGVar1;
  LocalSinkState *pLVar2;
  bool bVar3;
  reference this_00;
  reference this_01;
  const_reference this_02;
  type gstate_p;
  type lstate_p;
  idx_t i;
  ulong __n;
  OperatorSinkCombineInput combine_distinct_input;
  
  pGVar1 = input->global_state;
  pLVar2 = input->local_state;
  combine_distinct_input.interrupt_state = input->interrupt_state;
  combine_distinct_input.global_state = pGVar1;
  combine_distinct_input.local_state = pLVar2;
  CombineDistinct(this,context,&combine_distinct_input);
  bVar3 = CanSkipRegularSink(this);
  if (!bVar3) {
    for (__n = 0; __n < (ulong)(((long)(this->groupings).
                                       super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                       .
                                       super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->groupings).
                                      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                      .
                                      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x70);
        __n = __n + 1) {
      this_00 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::get<true>
                          ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)(pGVar1 + 1),
                           __n);
      this_01 = vector<duckdb::HashAggregateGroupingLocalState,_true>::get<true>
                          ((vector<duckdb::HashAggregateGroupingLocalState,_true> *)
                           &pLVar2[2].partition_info.min_batch_index,__n);
      this_02 = vector<duckdb::HashAggregateGroupingData,_true>::get<true>(&this->groupings,__n);
      gstate_p = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                 ::operator*(&this_00->table_state);
      lstate_p = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
                 ::operator*(&this_01->table_state);
      RadixPartitionedHashTable::Combine(&this_02->table_data,context,gstate_p,lstate_p);
    }
  }
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalHashAggregate::Combine(ExecutionContext &context, OperatorSinkCombineInput &input) const {
	auto &gstate = input.global_state.Cast<HashAggregateGlobalSinkState>();
	auto &llstate = input.local_state.Cast<HashAggregateLocalSinkState>();

	OperatorSinkCombineInput combine_distinct_input {gstate, llstate, input.interrupt_state};
	CombineDistinct(context, combine_distinct_input);

	if (CanSkipRegularSink()) {
		return SinkCombineResultType::FINISHED;
	}
	for (idx_t i = 0; i < groupings.size(); i++) {
		auto &grouping_gstate = gstate.grouping_states[i];
		auto &grouping_lstate = llstate.grouping_states[i];

		auto &grouping = groupings[i];
		auto &table = grouping.table_data;
		table.Combine(context, *grouping_gstate.table_state, *grouping_lstate.table_state);
	}

	return SinkCombineResultType::FINISHED;
}